

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,function<void_(Pipeline_*)> *provider,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  element_type *__v;
  __index_type _Var1;
  FunctionProvider *__p;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar2;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> sdp;
  Stream local_88;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_70;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_60;
  _Any_data local_50;
  code *local_40;
  
  __p = (FunctionProvider *)operator_new(0x50);
  std::function<void_(Pipeline_*)>::function((function<void_(Pipeline_*)> *)&local_50,provider);
  StreamDataProvider::StreamDataProvider((StreamDataProvider *)__p,false);
  (__p->super_StreamDataProvider)._vptr_StreamDataProvider =
       (_func_int **)&PTR__FunctionProvider_002ee4e8;
  std::function<void_(Pipeline_*)>::function(&__p->p1,(function<void_(Pipeline_*)> *)&local_50);
  (__p->p2).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->p2)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__p->p2).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->p2).super__Function_base._M_functor + 8) = 0;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::
  shared_ptr<(anonymous_namespace)::FunctionProvider,void>(&local_60,__p);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  __v = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  if (__v != (element_type *)0x0) {
    _Var1 = (__v->value).
            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ._M_index;
    if (_Var1 == '\x0f') {
      pvVar2 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&__v->value);
LAB_0020044b:
      _Var1 = *(__index_type *)
               ((long)&(((pvVar2->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var1 == '\r') {
      pvVar2 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(__v->qpdf,*(QPDFObjGen *)&(__v->og).obj);
      goto LAB_0020044b;
    }
    if (_Var1 == '\n') {
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      goto LAB_00200497;
    }
  }
  assertType(this,"stream",false);
  local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00200497:
  local_70.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_60.
           super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_70.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_60.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_60.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_60.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_60.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ::qpdf::Stream::replaceStreamData(&local_88,&local_70,filter,decode_parms);
  if (local_70.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_60.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::function<void(Pipeline*)> provider,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto sdp = std::shared_ptr<StreamDataProvider>(new FunctionProvider(provider));
    as_stream(error).replaceStreamData(sdp, filter, decode_parms);
}